

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pager.cpp
# Opt level: O2

void pager::create(string *fileName)

{
  r_file f;
  vector<unsigned_char,_std::allocator<unsigned_char>_> block;
  allocator<char> local_31;
  r_file local_30;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_28;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_28,"w+",&local_31);
  r_file::open(&local_30,(char *)fileName,(int)&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_28,0x1000,
             (allocator_type *)&local_31);
  memset(local_28._M_impl.super__Vector_impl_data._M_start + 0xc,0,0xff4);
  local_28._M_impl.super__Vector_impl_data._M_start[0] = '\x01';
  local_28._M_impl.super__Vector_impl_data._M_start[1] = '\0';
  local_28._M_impl.super__Vector_impl_data._M_start[2] = '\0';
  local_28._M_impl.super__Vector_impl_data._M_start[3] = '\0';
  local_28._M_impl.super__Vector_impl_data._M_start[4] = '\0';
  local_28._M_impl.super__Vector_impl_data._M_start[5] = '\0';
  local_28._M_impl.super__Vector_impl_data._M_start[6] = '\0';
  local_28._M_impl.super__Vector_impl_data._M_start[7] = '\0';
  local_28._M_impl.super__Vector_impl_data._M_start[8] = '\0';
  local_28._M_impl.super__Vector_impl_data._M_start[9] = '\0';
  local_28._M_impl.super__Vector_impl_data._M_start[10] = '\0';
  local_28._M_impl.super__Vector_impl_data._M_start[0xb] = '\0';
  block_write_file<unsigned_char,r_file>
            (local_28._M_impl.super__Vector_impl_data._M_start,0x1000,&local_30,0x1000);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_28);
  r_file::~r_file(&local_30);
  return;
}

Assistant:

void pager::create(const std::string& fileName)
{
    auto f = r_file::open(fileName, "w+");

    vector<uint8_t> block(pager::block_size());

    memset(&block[0], 0, pager::block_size());
    *(uint32_t*)&block[0] = 1;
    *(uint64_t*)&block[4] = 0;

    block_write_file(&block[0], pager::block_size(), f);
}